

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

void __thiscall llvm::yaml::SequenceNode::increment(SequenceNode *this)

{
  SequenceType SVar1;
  Token *pTVar2;
  Node *pNVar3;
  undefined1 local_178 [56];
  Token local_140;
  undefined1 local_108 [56];
  undefined1 local_d0 [56];
  Token local_98;
  undefined1 local_60 [8];
  Token T;
  
  if (*(char *)(*(long *)&((((this->super_Node).Doc)->_M_t).
                           super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                           .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                          stream->scanner + 0x4a) == '\x01') {
    this->IsAtEnd = true;
    this->CurrentEntry = (Node *)0x0;
    return;
  }
  if (this->CurrentEntry != (Node *)0x0) {
    (*this->CurrentEntry->_vptr_Node[1])();
  }
  pTVar2 = Node::peekNext(&this->super_Node);
  Token::Token((Token *)local_60,pTVar2);
  SVar1 = this->SeqType;
  if (SVar1 == ST_Indentless) {
    if (local_60._0_4_ == TK_BlockEntry) {
      Node::getNext((Token *)local_108,&this->super_Node);
      std::__cxx11::string::~string((string *)(local_108 + 0x18));
      pNVar3 = Node::parseBlockNode(&this->super_Node);
LAB_00dcb25d:
      this->CurrentEntry = pNVar3;
      if (pNVar3 != (Node *)0x0) goto LAB_00dcb2c3;
    }
  }
  else if (SVar1 == ST_Flow) {
    switch(local_60._0_4_) {
    case 0:
      break;
    default:
      if (this->WasPreviousTokenFlowEntry != false) {
        pNVar3 = Node::parseBlockNode(&this->super_Node);
        this->CurrentEntry = pNVar3;
        if (pNVar3 == (Node *)0x0) {
          this->IsAtEnd = true;
        }
        this->WasPreviousTokenFlowEntry = false;
        goto LAB_00dcb2c3;
      }
      Twine::Twine((Twine *)((long)&T.Value.field_2 + 8),"Expected , between entries!");
      Node::setError(&this->super_Node,(Twine *)((long)&T.Value.field_2 + 8),(Token *)local_60);
      break;
    case 2:
    case 5:
    case 6:
      Twine::Twine((Twine *)((long)&T.Value.field_2 + 8),"Could not find closing ]!");
      Node::setError(&this->super_Node,(Twine *)((long)&T.Value.field_2 + 8),(Token *)local_60);
      break;
    case 0xb:
      Node::getNext((Token *)local_d0,&this->super_Node);
      std::__cxx11::string::~string((string *)(local_d0 + 0x18));
      this->WasPreviousTokenFlowEntry = true;
      increment(this);
      goto LAB_00dcb2c3;
    case 0xd:
      Node::getNext(&local_98,&this->super_Node);
      pTVar2 = &local_98;
LAB_00dcb2b5:
      std::__cxx11::string::~string((string *)&pTVar2->Value);
    }
  }
  else {
    if (SVar1 != ST_Block) goto LAB_00dcb2c3;
    if (local_60._0_4_ != TK_Error) {
      if (local_60._0_4_ == TK_BlockEnd) {
        Node::getNext(&local_140,&this->super_Node);
        pTVar2 = &local_140;
        goto LAB_00dcb2b5;
      }
      if (local_60._0_4_ == TK_BlockEntry) {
        Node::getNext((Token *)local_178,&this->super_Node);
        std::__cxx11::string::~string((string *)(local_178 + 0x18));
        pNVar3 = Node::parseBlockNode(&this->super_Node);
        goto LAB_00dcb25d;
      }
      Twine::Twine((Twine *)((long)&T.Value.field_2 + 8),
                   "Unexpected token. Expected Block Entry or Block End.");
      Node::setError(&this->super_Node,(Twine *)((long)&T.Value.field_2 + 8),(Token *)local_60);
    }
  }
  this->IsAtEnd = true;
  this->CurrentEntry = (Node *)0x0;
LAB_00dcb2c3:
  std::__cxx11::string::~string((string *)&T.Range.Length);
  return;
}

Assistant:

void SequenceNode::increment() {
  if (failed()) {
    IsAtEnd = true;
    CurrentEntry = nullptr;
    return;
  }
  if (CurrentEntry)
    CurrentEntry->skip();
  Token T = peekNext();
  if (SeqType == ST_Block) {
    switch (T.Kind) {
    case Token::TK_BlockEntry:
      getNext();
      CurrentEntry = parseBlockNode();
      if (!CurrentEntry) { // An error occurred.
        IsAtEnd = true;
        CurrentEntry = nullptr;
      }
      break;
    case Token::TK_BlockEnd:
      getNext();
      IsAtEnd = true;
      CurrentEntry = nullptr;
      break;
    default:
      setError( "Unexpected token. Expected Block Entry or Block End."
              , T);
      LLVM_FALLTHROUGH;
    case Token::TK_Error:
      IsAtEnd = true;
      CurrentEntry = nullptr;
    }
  } else if (SeqType == ST_Indentless) {
    switch (T.Kind) {
    case Token::TK_BlockEntry:
      getNext();
      CurrentEntry = parseBlockNode();
      if (!CurrentEntry) { // An error occurred.
        IsAtEnd = true;
        CurrentEntry = nullptr;
      }
      break;
    default:
    case Token::TK_Error:
      IsAtEnd = true;
      CurrentEntry = nullptr;
    }
  } else if (SeqType == ST_Flow) {
    switch (T.Kind) {
    case Token::TK_FlowEntry:
      // Eat the flow entry and recurse.
      getNext();
      WasPreviousTokenFlowEntry = true;
      return increment();
    case Token::TK_FlowSequenceEnd:
      getNext();
      LLVM_FALLTHROUGH;
    case Token::TK_Error:
      // Set this to end iterator.
      IsAtEnd = true;
      CurrentEntry = nullptr;
      break;
    case Token::TK_StreamEnd:
    case Token::TK_DocumentEnd:
    case Token::TK_DocumentStart:
      setError("Could not find closing ]!", T);
      // Set this to end iterator.
      IsAtEnd = true;
      CurrentEntry = nullptr;
      break;
    default:
      if (!WasPreviousTokenFlowEntry) {
        setError("Expected , between entries!", T);
        IsAtEnd = true;
        CurrentEntry = nullptr;
        break;
      }
      // Otherwise it must be a flow entry.
      CurrentEntry = parseBlockNode();
      if (!CurrentEntry) {
        IsAtEnd = true;
      }
      WasPreviousTokenFlowEntry = false;
      break;
    }
  }
}